

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

OutPt * ClipperLib::DupOutPt(OutPt *outPt,bool InsertAfter)

{
  OutPt *pOVar1;
  cInt cVar2;
  OutPt *pOVar3;
  bool bVar4;
  ulong uVar5;
  undefined7 in_register_00000031;
  
  pOVar3 = (OutPt *)operator_new(0x28);
  cVar2 = (outPt->Pt).Y;
  (pOVar3->Pt).X = (outPt->Pt).X;
  (pOVar3->Pt).Y = cVar2;
  pOVar3->Idx = outPt->Idx;
  bVar4 = !InsertAfter;
  uVar5 = CONCAT71(in_register_00000031,InsertAfter) & 0xffffffff;
  pOVar1 = (&outPt->Next)[bVar4];
  (&pOVar3->Next)[bVar4] = pOVar1;
  (&pOVar3->Next)[uVar5] = outPt;
  (&pOVar1->Next)[uVar5] = pOVar3;
  (&outPt->Next)[bVar4] = pOVar3;
  return pOVar3;
}

Assistant:

OutPt* DupOutPt(OutPt* outPt, bool InsertAfter)
{
  OutPt* result = new OutPt;
  result->Pt = outPt->Pt;
  result->Idx = outPt->Idx;
  if (InsertAfter)
  {
    result->Next = outPt->Next;
    result->Prev = outPt;
    outPt->Next->Prev = result;
    outPt->Next = result;
  } 
  else
  {
    result->Prev = outPt->Prev;
    result->Next = outPt;
    outPt->Prev->Next = result;
    outPt->Prev = result;
  }
  return result;
}